

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_folded
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel,bool explicit_key)

{
  size_t *psVar1;
  code *pcVar2;
  Location loc;
  bool bVar3;
  error_flags eVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  undefined3 in_register_00000081;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ro_substr pattern;
  basic_substring<const_char> bVar14;
  basic_substring<const_char> local_70;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  long local_48;
  basic_substring<const_char> local_40;
  
  local_40.len = s.len;
  local_40.str = s.str;
  if (CONCAT31(in_register_00000081,explicit_key) != 0) {
    std::ostream::write((char *)((this->
                                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ).m_stream + 0x10),0x1f9445);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 2;
  }
  pattern.len = 1;
  pattern.str = "\r";
  sVar5 = basic_substring<const_char>::find(&local_40,pattern,0);
  if (sVar5 != 0xffffffffffffffff) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_70.str = (char *)0x0;
    local_70.len = 0x5a93;
    local_60 = 0;
    pcStack_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_50 = 0x65;
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x5a93) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x5a93) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    yml::error("check failed: s.find(\"\\r\") == csubstr::npos",0x2b,loc);
  }
  bVar14 = basic_substring<const_char>::trimr(&local_40,'\n');
  uVar13 = bVar14.len;
  pcVar6 = bVar14.str;
  uVar7 = local_40.len - uVar13;
  if (uVar7 == 1) {
    pcVar9 = ">\n";
    lVar11 = 2;
  }
  else {
    if (uVar7 == 0) {
      pcVar9 = ">-\n";
    }
    else {
      pcVar9 = ">+\n";
    }
    lVar11 = 3;
  }
  std::ostream::write((char *)((this->
                               super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).m_stream + 0x10),(long)pcVar9);
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + lVar11;
  if (uVar13 != 0) {
    local_48 = ilevel + 1;
    uVar10 = 0;
    uVar12 = 0;
    do {
      pcVar9 = pcVar6 + uVar12;
      uVar12 = uVar12 + 1;
      if (*pcVar9 == '\n') {
        if (uVar13 < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1f9037,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        uVar8 = uVar12;
        if (uVar12 == 0xffffffffffffffff) {
          uVar8 = uVar13;
        }
        if (uVar8 < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1f9037,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (uVar13 < uVar8) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1f9037,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_70,pcVar6 + uVar10,uVar8 - uVar10);
        sVar5 = local_70.len;
        pcVar9 = local_70.str;
        lVar11 = local_48;
        if (ilevel != 0xffffffffffffffff) {
          do {
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream + '\x10');
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream + '\x10');
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        if (pcVar9 != (char *)0x0 && sVar5 != 0) {
          std::ostream::write((char *)((this->
                                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).m_stream + 0x10),(long)pcVar9);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + sVar5;
        }
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream + '\x10');
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
        uVar10 = uVar12;
      }
    } while (uVar12 != uVar13);
    if (uVar10 <= uVar13 && uVar13 - uVar10 != 0) {
      if (ilevel != 0xffffffffffffffff) {
        lVar11 = ilevel + 1;
        do {
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      basic_substring<const_char>::basic_substring(&local_70,pcVar6 + uVar10,uVar13 - uVar10);
      sVar5 = local_70.len;
      if (local_70.str != (char *)0x0 && local_70.len != 0) {
        std::ostream::write((char *)((this->
                                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ).m_stream + 0x10),(long)local_70.str);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + sVar5;
      }
    }
    if (uVar7 == 0) {
      bVar3 = true;
      goto LAB_0018f7aa;
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
    uVar7 = uVar7 - 1;
  }
  bVar3 = uVar7 == 0;
  if (bVar3) {
    bVar3 = true;
  }
  else {
    uVar13 = 0;
    do {
      lVar11 = ilevel + 1;
      if (ilevel != 0xffffffffffffffff) {
        do {
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream + '\x10');
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      uVar13 = uVar13 + 1;
      if (uVar13 < uVar7 || explicit_key) {
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream + '\x10');
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
      }
    } while (uVar13 != uVar7);
  }
LAB_0018f7aa:
  if ((bVar3 & explicit_key) != 0) {
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_folded(csubstr s, size_t ilevel, bool explicit_key)
{
    if(explicit_key)
    {
        this->Writer::_do_write("? ");
    }
    RYML_ASSERT(s.find("\r") == csubstr::npos);
    csubstr trimmed = s.trimr('\n');
    size_t numnewlines_at_end = s.len - trimmed.len;
    if(numnewlines_at_end == 0)
    {
        this->Writer::_do_write(">-\n");
    }
    else if(numnewlines_at_end == 1)
    {
        this->Writer::_do_write(">\n");
    }
    else if(numnewlines_at_end > 1)
    {
        this->Writer::_do_write(">+\n");
    }
    if(trimmed.len)
    {
        size_t pos = 0; // tracks the last character that was already written
        for(size_t i = 0; i < trimmed.len; ++i)
        {
            if(trimmed[i] != '\n')
                continue;
            // write everything up to this point
            csubstr since_pos = trimmed.range(pos, i+1); // include the newline
            pos = i+1; // because of the newline
            _rymlindent_nextline()
            this->Writer::_do_write(since_pos);
            this->Writer::_do_write('\n'); // write the newline twice
        }
        if(pos < trimmed.len)
        {
            _rymlindent_nextline()
            this->Writer::_do_write(trimmed.sub(pos));
        }
        if(numnewlines_at_end)
        {
            this->Writer::_do_write('\n');
            --numnewlines_at_end;
        }
    }
    for(size_t i = 0; i < numnewlines_at_end; ++i)
    {
        _rymlindent_nextline()
        if(i+1 < numnewlines_at_end || explicit_key)
            this->Writer::_do_write('\n');
    }
    if(explicit_key && !numnewlines_at_end)
        this->Writer::_do_write('\n');
}